

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk54(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk54 *peVar4;
  envy_bios_power_unk54_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk54 *unk54;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk54;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk54.version);
    if ((bios->power).unk54.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk54.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk54.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk54.entriesnum);
      (bios->power).unk54.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk54_entry *)malloc((ulong)(bios->power).unk54.entriesnum << 2);
      (bios->power).unk54.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk54.entriesnum; data = data + 1) {
        (bios->power).unk54.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk54.hlen + data * (bios->power).unk54.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown PSTATE MEMORY CLK FREQ table version 0x%x\n",
              (ulong)(bios->power).unk54.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk54(struct envy_bios *bios) {
	struct envy_bios_power_unk54 *unk54 = &bios->power.unk54;
	int i, err = 0;

	if (!unk54->offset)
		return -EINVAL;

	bios_u8(bios, unk54->offset + 0x0, &unk54->version);
	switch(unk54->version) {
	case 0x10:
		err |= bios_u8(bios, unk54->offset + 0x1, &unk54->hlen);
		err |= bios_u8(bios, unk54->offset + 0x2, &unk54->rlen);
		err |= bios_u8(bios, unk54->offset + 0x3, &unk54->entriesnum);
		unk54->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown PSTATE MEMORY CLK FREQ table version 0x%x\n", unk54->version);
		return -EINVAL;
	};

	err = 0;
	unk54->entries = malloc(unk54->entriesnum * sizeof(struct envy_bios_power_unk54_entry));
	for (i = 0; i < unk54->entriesnum; i++) {
		uint32_t data = unk54->offset + unk54->hlen + i * unk54->rlen;

		unk54->entries[i].offset = data;
	}

	return 0;
}